

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set-pseudo-dt-data-loc.cpp
# Opt level: O3

_tGetPathElemsSuffixRelRet * __thiscall
yactfr::internal::DataLocSetter::_getPathElemsSuffixRel2
          (_tGetPathElemsSuffixRelRet *__return_storage_ptr__,DataLocSetter *this,
          PseudoDataLoc *pseudoDataLoc,const_iterator searchEntryIt)

{
  type tVar1;
  string msg;
  TextLocation loc;
  _tGetPathElemsSuffixRelRet *p_Var2;
  pointer poVar3;
  type tVar4;
  pointer poVar5;
  PathElements pathElemsSuffix;
  PathElems normPathElems;
  undefined8 in_stack_ffffffffffffff50;
  bool bVar6;
  undefined7 uVar7;
  undefined8 in_stack_ffffffffffffff60;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined1 local_90 [24];
  vector<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_78;
  _tGetPathElemsSuffixRelRet *local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  if (pseudoDataLoc->_kind != Rel2) {
    __assert_fail("pseudoDataLoc.kind() == PseudoDataLoc::Kind::Rel2",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/eepp[P]yactfr/yactfr/internal/metadata/set-pseudo-dt-data-loc.cpp"
                  ,0x7c,
                  "_tGetPathElemsSuffixRelRet yactfr::internal::DataLocSetter::_getPathElemsSuffixRel2(const PseudoDataLoc &, _tMemberNames::const_iterator) const"
                 );
  }
  local_78.
  super__Vector_base<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.
  super__Vector_base<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  poVar5 = (pseudoDataLoc->_pathElems).
           super__Vector_base<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_58 = __return_storage_ptr__;
  if (poVar5 != (pseudoDataLoc->_pathElems).
                super__Vector_base<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      if ((poVar5->super_type).m_initialized == true) {
        std::
        vector<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::push_back(&local_78,poVar5);
        poVar3 = local_78.
                 super__Vector_base<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      else if (local_78.
               super__Vector_base<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start ==
               local_78.
               super__Vector_base<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish) {
        bVar6 = false;
        std::
        vector<boost::optional<std::__cxx11::string>,std::allocator<boost::optional<std::__cxx11::string>>>
        ::emplace_back<boost::optional<std::__cxx11::string>>
                  ((vector<boost::optional<std::__cxx11::string>,std::allocator<boost::optional<std::__cxx11::string>>>
                    *)&local_78,
                   (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&stack0xffffffffffffff58);
        poVar3 = local_78.
                 super__Vector_base<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if ((bVar6 == true) && ((undefined1 *)in_stack_ffffffffffffff60 != local_90)) {
          operator_delete((void *)in_stack_ffffffffffffff60,local_90._0_8_ + 1);
          poVar3 = local_78.
                   super__Vector_base<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        }
      }
      else {
        poVar3 = local_78.
                 super__Vector_base<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1;
        if (local_78.
            super__Vector_base<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1].super_type.m_initialized == true) {
          tVar1 = local_78.
                  super__Vector_base<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1].super_type.m_storage.dummy_.
                  aligner_;
          tVar4 = (type)((long)&local_78.
                                super__Vector_base<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish[-1].super_type.m_storage.
                                dummy_ + 0x10);
          local_78.
          super__Vector_base<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = poVar3;
          if (tVar1 != tVar4) {
            operator_delete((void *)tVar1,*(long *)tVar4 + 1);
          }
          (poVar3->super_type).m_initialized = false;
          poVar3 = local_78.
                   super__Vector_base<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        }
      }
      local_78.
      super__Vector_base<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = poVar3;
      poVar3 = local_78.
               super__Vector_base<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      poVar5 = poVar5 + 1;
    } while (poVar5 != (pseudoDataLoc->_pathElems).
                       super__Vector_base<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
    bVar6 = false;
    uVar7 = 0;
    uVar8 = (type)0x0;
    uVar9 = 0;
    if (local_78.
        super__Vector_base<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_78.
        super__Vector_base<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      poVar5 = local_78.
               super__Vector_base<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        if ((poVar5->super_type).m_initialized == true) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&stack0xffffffffffffff58,(value_type *)&(poVar5->super_type).m_storage);
        }
        else {
          if (searchEntryIt._M_current ==
              (this->_memberNames).
              super__Vector_base<std::vector<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::allocator<std::vector<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            local_50[0] = local_40;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_50,"Cannot reach the parent of the root scope.","");
            msg.field_2._8_8_ = in_stack_ffffffffffffff50;
            msg._0_24_ = pseudoDataLoc->_loc;
            loc._offset._1_7_ = uVar7;
            loc._offset._0_1_ = bVar6;
            loc._lineNumber = uVar8;
            loc._colNumber = uVar9;
            throwTextParseError(msg,loc);
          }
          searchEntryIt._M_current = searchEntryIt._M_current + -1;
        }
        poVar5 = poVar5 + 1;
      } while (poVar5 != poVar3);
    }
  }
  p_Var2 = local_58;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_58->first,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&stack0xffffffffffffff58);
  (p_Var2->second)._M_current = searchEntryIt._M_current;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&stack0xffffffffffffff58);
  std::
  vector<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_78);
  return p_Var2;
}

Assistant:

_tGetPathElemsSuffixRelRet _getPathElemsSuffixRel2(const PseudoDataLoc& pseudoDataLoc,
                                                       _tMemberNames::const_iterator searchEntryIt) const
    {
        assert(pseudoDataLoc.kind() == PseudoDataLoc::Kind::Rel2);

        // normalize the path (remove any unnecessary "parent" item)
        PseudoDataLoc::PathElems normPathElems;

        for (auto it = pseudoDataLoc.pathElems().begin();
                it != pseudoDataLoc.pathElems().end(); ++it) {
            if (*it) {
                // add member name
                normPathElems.push_back(*it);
            } else {
                // "parent"
                if (normPathElems.empty()) {
                    // empty path: add parent
                    normPathElems.push_back(boost::none);
                } else {
                    normPathElems.pop_back();
                }
            }
        }

        // now iterate the normalized path
        DataLocation::PathElements pathElemsSuffix;

        for (auto& pathElem : normPathElems) {
            if (pathElem) {
                // append as suffix
                pathElemsSuffix.push_back(*pathElem);
            } else {
                // go to parent, if any
                if (searchEntryIt == _memberNames.begin()) {
                    throwTextParseError("Cannot reach the parent of the root scope.",
                                        pseudoDataLoc.loc());
                }

                --searchEntryIt;
            }
        }

        return {pathElemsSuffix, searchEntryIt};
    }